

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingRenderCase::~UBOBindingRenderCase
          (UBOBindingRenderCase *this)

{
  pointer pVVar1;
  pointer puVar2;
  
  (this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__UBOBindingRenderCase_00b2bee0;
  deinit(this);
  pVVar1 = (this->m_expectedColors).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_expectedColors).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  puVar2 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_buffers).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  LayoutBindingRenderCase::~LayoutBindingRenderCase(&this->super_LayoutBindingRenderCase);
  return;
}

Assistant:

UBOBindingRenderCase::~UBOBindingRenderCase (void)
{
	deinit();
}